

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyManager.cpp
# Opt level: O1

void __thiscall Node::FindAdd(Node *this,char *part,bool *done,Node **newNode)

{
  char cVar1;
  char *pcVar2;
  Node *pNVar3;
  char *part2;
  char *part1;
  char *part_00;
  char *pcVar4;
  Node **ppNVar5;
  
  if ((*done == false) && (pcVar2 = this->uri, *pcVar2 == *part)) {
    cVar1 = *pcVar2;
    pcVar4 = pcVar2;
    for (part_00 = part; (cVar1 != '\0' && (*part_00 != '\0')); part_00 = part_00 + 1) {
      part2 = part_00;
      part1 = pcVar4;
      if (cVar1 != *part_00) goto LAB_0012d439;
      cVar1 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    }
    part2 = part;
    part1 = pcVar2;
    if ((*part_00 != '\0') &&
       (ppNVar5 = this->next, part2 = part_00, part1 = pcVar4, ppNVar5 != (Node **)0x0)) {
      pNVar3 = *ppNVar5;
      while (pNVar3 != (Node *)0x0) {
        ppNVar5 = ppNVar5 + 1;
        FindAdd(pNVar3,part_00,done,newNode);
        if (*done != false) {
          return;
        }
        pNVar3 = *ppNVar5;
      }
    }
LAB_0012d439:
    pNVar3 = Add(this,part1,part2);
    *newNode = pNVar3;
    *done = true;
  }
  return;
}

Assistant:

void Node::FindAdd(const char* part, bool *done, class Node ** newNode) {
	if (*done)
		return;
	class Node **nx;
	char *tmp1;
	const char *tmp2;

	tmp1 = uri;
	tmp2 = part;


	//first character is different, we are not interested by this node
	if (*tmp1 != *tmp2)
		return;


//
//	if ( strcmp(tmp1,tmp2) == 0) {
//		*newNode = Add(tmp1, tmp2);
//		*done = true;
//		return;
//	}


//	cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
	while (*tmp1 && *tmp2) {
//		cerr << "----->1aaa tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (*tmp1 == *tmp2) {
			tmp1++;
			tmp2++;
		} else {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl ;
			*newNode = Add(tmp1, tmp2);
			*done = true;
//			if (*newNode == NULL) {cerr << "-----> 1 uposss" << done << endl ; }
			return;
		}
	}

//	cerr << "part: " << part << endl;

	if (*tmp2 != '\0') {
//		cerr << "----->1 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		if (next) {
//			cerr << "----->2 tmp1 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
			nx = next;
			while (*nx != NULL) {
				(*nx)->FindAdd(tmp2, done, newNode);
				if (*done) {
					return;
				}
				nx++;
			}
		}

//		cerr << "----->1 tmp3 & tmp2: " << tmp1 << "\t" << tmp2 << endl;
		*newNode = Add(tmp1, tmp2);
		//	if (*newNode == NULL) {cerr << "-----> 3 uposss" << done << endl ; }
		*done = true;
	} else {
//		cerr << "----->3 tmp1 & tmp2: " << uri  << "\t" << part << endl ;
		//if (leaf == NULL) {
//			cerr << "1" << endl;
		*newNode = Add(uri, part);
		*done = true;
//		} else {
//			cerr << "2" << endl;
//			*newNode = this;
//			*done = true;
//		}
	}

}